

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall pugi::xml_node::append_copy(xml_node *this,xml_node *proto)

{
  bool bVar1;
  xml_allocator *alloc;
  xml_node_struct *pxVar2;
  xml_node_type child;
  xml_node_type parent;
  
  parent = node_null;
  child = node_null;
  if (proto->_root != (xml_node_struct *)0x0) {
    child = (xml_node_type)proto->_root->header & (node_doctype|node_declaration);
  }
  pxVar2 = this->_root;
  if (pxVar2 != (xml_node_struct *)0x0) {
    parent = (xml_node_type)pxVar2->header & (node_doctype|node_declaration);
  }
  bVar1 = impl::anon_unknown_0::allow_insert_child(parent,child);
  if (bVar1) {
    alloc = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(pxVar2);
    pxVar2 = impl::anon_unknown_0::allocate_node(alloc,child);
    if (pxVar2 != (xml_node_struct *)0x0) {
      impl::anon_unknown_0::append_node(pxVar2,this->_root);
      impl::anon_unknown_0::node_copy_tree(pxVar2,proto->_root);
      return (xml_node)pxVar2;
    }
  }
  return (xml_node)(xml_node_struct *)0x0;
}

Assistant:

PUGI__FN xml_node xml_node::append_copy(const xml_node& proto)
	{
		xml_node_type type_ = proto.type();
		if (!impl::allow_insert_child(type(), type_)) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		xml_node n(impl::allocate_node(alloc, type_));
		if (!n) return xml_node();

		impl::append_node(n._root, _root);
		impl::node_copy_tree(n._root, proto._root);

		return n;
	}